

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

string * __thiscall
duckdb::ArrowExtensionMetadata::GetTypeName_abi_cxx11_
          (string *__return_storage_ptr__,ArrowExtensionMetadata *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->type_name);
  return __return_storage_ptr__;
}

Assistant:

string ArrowExtensionMetadata::GetTypeName() const {
	return type_name;
}